

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

void INT_EVreturn_event_buffer(CManager_conflict cm,void *event)

{
  _event_path_data *p_Var1;
  event_item *event_00;
  queue_item *pqVar2;
  queue_item **ppqVar3;
  queue_item *pqVar4;
  event_path_data evp;
  
  p_Var1 = cm->evp;
  if (p_Var1->taken_events_list != (queue_item *)0x0) {
    pqVar2 = (queue_item *)0x0;
    pqVar4 = p_Var1->taken_events_list;
    do {
      event_00 = pqVar4->item;
      if (((event_00->decoded_event <= event) &&
          (evp = (event_path_data)((long)event_00->decoded_event + event_00->event_len),
          event <= evp)) ||
         ((event_00->encoded_event <= event &&
          (evp = (event_path_data)((long)event_00->encoded_event + event_00->event_len),
          event <= evp)))) {
        ppqVar3 = &pqVar2->next;
        if (pqVar2 == (queue_item *)0x0) {
          ppqVar3 = &p_Var1->taken_events_list;
        }
        *ppqVar3 = pqVar4->next;
        return_event(evp,event_00);
        pqVar4->next = p_Var1->queue_items_free_list;
        p_Var1->queue_items_free_list = pqVar4;
        return;
      }
      ppqVar3 = &pqVar4->next;
      pqVar2 = pqVar4;
      pqVar4 = *ppqVar3;
    } while (*ppqVar3 != (queue_item *)0x0);
  }
  fprintf(_stderr,"Event %p not found in taken events list\n");
  return;
}

Assistant:

void
INT_EVreturn_event_buffer(CManager cm, void *event)
{
    event_path_data evp = cm->evp;
    queue_item *tmp, *last = NULL;
    /* search through list for event and then dereference it */
    (void)cm;
    (void)event;

    tmp = evp->taken_events_list;
    while (tmp != NULL) {
	if (((tmp->item->decoded_event <= event) &&
	    ((char *) event <= ((char *) tmp->item->decoded_event + tmp->item->event_len))) ||
	    ((tmp->item->encoded_event <= event) &&
	     ((char *) event <= ((char *) tmp->item->encoded_event + tmp->item->event_len)))) {
	    if (last == NULL) {
		evp->taken_events_list = tmp->next;
	    } else {
		last->next = tmp->next;
	    }
	    return_event(cm->evp, tmp->item);
	    tmp->next = evp->queue_items_free_list;
	    evp->queue_items_free_list = tmp;
	    return;
	}
	last = tmp;
	tmp = tmp->next;
    }
    fprintf(stderr, "Event %p not found in taken events list\n",
	    event);
}